

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O0

void __thiscall
bitfoot::Bitfoot::AddMove<true,(bitfoot::MoveType)6>
          (Bitfoot *this,int piece,int from,int to,int score,int cap,int promo)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  Move *this_00;
  int *piVar4;
  bool local_3e;
  bool local_3b;
  Move *move;
  int cap_local;
  int score_local;
  int to_local;
  int from_local;
  int piece_local;
  Bitfoot *this_local;
  
  if (0x7f < this->moveCount + 1) {
    __assert_fail("(moveCount + 1) < MaxMoves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xa78,
                  "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = true, type = bitfoot::KingMove]"
                 );
  }
  if ((from & 0xffffffc0U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xa7a,
                  "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = true, type = bitfoot::KingMove]"
                 );
  }
  if ((to & 0xffffffc0U) != 0) {
    __assert_fail("IS_SQUARE(to)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xa7b,
                  "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = true, type = bitfoot::KingMove]"
                 );
  }
  if (piece < 2 || 0xd < piece) {
    __assert_fail("IS_PIECE(piece)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xa7c,
                  "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = true, type = bitfoot::KingMove]"
                 );
  }
  if ((piece & 1U) != 1) {
    __assert_fail("COLOR_OF(piece) == color",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xa7d,
                  "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = true, type = bitfoot::KingMove]"
                 );
  }
  if ((&_board)[from] != piece) {
    __assert_fail("_board[from] == piece",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xa7e,
                  "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = true, type = bitfoot::KingMove]"
                 );
  }
  iVar3 = score;
  if (score < 1) {
    iVar3 = -score;
  }
  if (31999 < iVar3) {
    __assert_fail("abs(score) < Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xa7f,
                  "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = true, type = bitfoot::KingMove]"
                 );
  }
  local_3b = true;
  if (cap != 0) {
    local_3b = 1 < cap && cap < 0xc;
  }
  if (!local_3b) {
    __assert_fail("!cap || ((cap >= Pawn) && (cap < King))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xa80,
                  "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = true, type = bitfoot::KingMove]"
                 );
  }
  if (cap != 0 && (cap & 1U) == 1) {
    __assert_fail("!cap || (COLOR_OF(cap) != color)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xa81,
                  "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = true, type = bitfoot::KingMove]"
                 );
  }
  local_3e = true;
  if (promo != 0) {
    local_3e = 3 < promo && promo < 0xc;
  }
  if (!local_3e) {
    __assert_fail("!promo || ((promo >= Knight) && (promo < King))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xa82,
                  "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = true, type = bitfoot::KingMove]"
                 );
  }
  if (promo != 0 && (promo & 1U) != 1) {
    __assert_fail("!promo || (COLOR_OF(promo) == color)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xa83,
                  "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = true, type = bitfoot::KingMove]"
                 );
  }
  iVar3 = this->moveCount;
  this->moveCount = iVar3 + 1;
  this_00 = this->moves + iVar3;
  Move::Init(this_00,KingMove,from,to,piece,cap,promo,score);
  bVar2 = Move::IsCapOrPromo(this_00);
  if (!bVar2) {
    bVar2 = IsKiller(this,this_00);
    if (bVar2) {
      piVar4 = Move::Score(this_00);
      *piVar4 = *piVar4 + 0x32;
    }
    else {
      iVar3 = Move::GetHistoryIndex(this_00);
      if ((char)_hist[iVar3] < -2) {
        __assert_fail("_hist[move.GetHistoryIndex()] >= -2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                      ,0xa90,
                      "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = true, type = bitfoot::KingMove]"
                     );
      }
      iVar3 = Move::GetHistoryIndex(this_00);
      if ('(' < (char)_hist[iVar3]) {
        __assert_fail("_hist[move.GetHistoryIndex()] <= 40",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                      ,0xa91,
                      "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = true, type = bitfoot::KingMove]"
                     );
      }
      iVar3 = Move::GetHistoryIndex(this_00);
      cVar1 = _hist[iVar3];
      piVar4 = Move::Score(this_00);
      *piVar4 = (int)cVar1 + *piVar4;
    }
  }
  return;
}

Assistant:

inline void AddMove(const int piece,
                      const int from,
                      const int to,
                      const int score,
                      const int cap,
                      const int promo)
  {
    assert((moveCount + 1) < MaxMoves);
    assert(IS_MOVE_TYPE(type));
    assert(IS_SQUARE(from));
    assert(IS_SQUARE(to));
    assert(IS_PIECE(piece));
    assert(COLOR_OF(piece) == color);
    assert(_board[from] == piece);
    assert(abs(score) < Infinity);
    assert(!cap || ((cap >= Pawn) && (cap < King)));
    assert(!cap || (COLOR_OF(cap) != color));
    assert(!promo || ((promo >= Knight) && (promo < King)));
    assert(!promo || (COLOR_OF(promo) == color));

    Move& move = moves[moveCount++];
    move.Init(type, from, to, piece, cap, promo,
              (score + ((type < KingMove)
                        ? (SquareValue(piece, to) - SquareValue(piece, from))
                        : 0)));

    if (!move.IsCapOrPromo()) {
      if (IsKiller(move)) {
        move.Score() += 50;
      }
      else {
        assert(_hist[move.GetHistoryIndex()] >= -2);
        assert(_hist[move.GetHistoryIndex()] <= 40);
        move.Score() += _hist[move.GetHistoryIndex()];
      }
    }
  }